

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

Curl_multi * Curl_multi_handle(int hashsize,int chashsize)

{
  Curl_multi *pCVar1;
  curl_hash *pcVar2;
  conncache *pcVar3;
  curl_llist *pcVar4;
  SessionHandle *pSVar5;
  
  pCVar1 = (Curl_multi *)(*Curl_ccalloc)(1,0xd0);
  if (pCVar1 != (Curl_multi *)0x0) {
    pCVar1->type = 0xbab1e;
    pcVar2 = Curl_mk_dnscache();
    pCVar1->hostcache = pcVar2;
    if (pcVar2 != (curl_hash *)0x0) {
      pcVar2 = Curl_hash_alloc(hashsize,hash_fd,fd_key_compare,sh_freeentry);
      pCVar1->sockhash = pcVar2;
      if (pcVar2 != (curl_hash *)0x0) {
        pcVar3 = Curl_conncache_init(chashsize);
        pCVar1->conn_cache = pcVar3;
        if (pcVar3 != (conncache *)0x0) {
          pcVar4 = Curl_llist_alloc(multi_freeamsg);
          pCVar1->msglist = pcVar4;
          if (pcVar4 != (curl_llist *)0x0) {
            pcVar4 = Curl_llist_alloc(multi_freeamsg);
            pCVar1->pending = pcVar4;
            if (pcVar4 != (curl_llist *)0x0) {
              pSVar5 = (SessionHandle *)curl_easy_init();
              pCVar1->closure_handle = pSVar5;
              if (pSVar5 != (SessionHandle *)0x0) {
                pSVar5->multi = pCVar1;
                (pSVar5->state).conn_cache = pCVar1->conn_cache;
                pCVar1->max_pipeline_length = 5;
                pCVar1->maxconnects = -1;
                return pCVar1;
              }
            }
          }
        }
      }
    }
    Curl_hash_destroy(pCVar1->sockhash);
    pCVar1->sockhash = (curl_hash *)0x0;
    Curl_hash_destroy(pCVar1->hostcache);
    pCVar1->hostcache = (curl_hash *)0x0;
    Curl_conncache_destroy(pCVar1->conn_cache);
    pCVar1->conn_cache = (conncache *)0x0;
    Curl_close(pCVar1->closure_handle);
    pCVar1->closure_handle = (SessionHandle *)0x0;
    Curl_llist_destroy(pCVar1->msglist,(void *)0x0);
    Curl_llist_destroy(pCVar1->pending,(void *)0x0);
    (*Curl_cfree)(pCVar1);
  }
  return (Curl_multi *)0x0;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize) /* connection hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->type = CURL_MULTI_HANDLE;

  multi->hostcache = Curl_mk_dnscache();
  if(!multi->hostcache)
    goto error;

  multi->sockhash = sh_init(hashsize);
  if(!multi->sockhash)
    goto error;

  multi->conn_cache = Curl_conncache_init(chashsize);
  if(!multi->conn_cache)
    goto error;

  multi->msglist = Curl_llist_alloc(multi_freeamsg);
  if(!multi->msglist)
    goto error;

  multi->pending = Curl_llist_alloc(multi_freeamsg);
  if(!multi->pending)
    goto error;

  /* allocate a new easy handle to use when closing cached connections */
  multi->closure_handle = curl_easy_init();
  if(!multi->closure_handle)
    goto error;

  multi->closure_handle->multi = multi;
  multi->closure_handle->state.conn_cache = multi->conn_cache;

  multi->max_pipeline_length = 5;

  /* -1 means it not set by user, use the default value */
  multi->maxconnects = -1;
  return (CURLM *) multi;

  error:

  Curl_hash_destroy(multi->sockhash);
  multi->sockhash = NULL;
  Curl_hash_destroy(multi->hostcache);
  multi->hostcache = NULL;
  Curl_conncache_destroy(multi->conn_cache);
  multi->conn_cache = NULL;
  Curl_close(multi->closure_handle);
  multi->closure_handle = NULL;
  Curl_llist_destroy(multi->msglist, NULL);
  Curl_llist_destroy(multi->pending, NULL);

  free(multi);
  return NULL;
}